

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     Finalize<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>,double,duckdb::EntropyFallbackFunction<duckdb::ModeString>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  idx_t iVar4;
  double dVar5;
  
  if (*states == (Vector)0x2) {
    duckdb::Vector::SetVectorType((VectorType)result);
    pdVar1 = *(double **)(result + 0x20);
    dVar5 = FinalizeEntropy<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>>
                      ((ModeState<duckdb::string_t,_duckdb::ModeString> *)
                       **(undefined8 **)(states + 0x20));
    *pdVar1 = dVar5;
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)result);
    if (count != 0) {
      lVar2 = *(long *)(states + 0x20);
      lVar3 = *(long *)(result + 0x20);
      iVar4 = 0;
      do {
        dVar5 = FinalizeEntropy<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>>
                          (*(ModeState<duckdb::string_t,_duckdb::ModeString> **)(lVar2 + iVar4 * 8))
        ;
        *(double *)(offset * 8 + lVar3 + iVar4 * 8) = dVar5;
        iVar4 = iVar4 + 1;
      } while (count != iVar4);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}